

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_order.c
# Opt level: O3

void rhash_swap_copy_u64_to_str(void *to,void *from,size_t length)

{
  ulong uVar1;
  ulong *puVar2;
  
  if ((((uint)length | (uint)from | (uint)to) & 7) == 0) {
    if (0 < (long)length) {
      puVar2 = (ulong *)(length + (long)from);
      do {
        uVar1 = *from;
        from = (void *)((long)from + 8);
        *(ulong *)to = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                       (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                       (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
                       (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
        to = (void *)((long)to + 8);
      } while (from < puVar2);
    }
  }
  else if (length != 0) {
    uVar1 = 0;
    do {
      *(undefined1 *)((long)to + uVar1) = *(undefined1 *)((long)from + (uVar1 ^ 7));
      uVar1 = uVar1 + 1;
    } while (length != uVar1);
  }
  return;
}

Assistant:

void rhash_swap_copy_u64_to_str(void* to, const void* from, size_t length)
{
	/* if all pointers and length are 64-bits aligned */
	if ( 0 == (( (uintptr_t)to | (uintptr_t)from | length ) & 7) ) {
		/* copy aligned memory block as 64-bit integers */
		const uint64_t* src = (const uint64_t*)from;
		const uint64_t* end = (const uint64_t*)((const char*)src + length);
		uint64_t* dst = (uint64_t*)to;
		while (src < end) *(dst++) = bswap_64( *(src++) );
	} else {
		size_t index;
		char* dst = (char*)to;
		for (index = 0; index < length; index++) *(dst++) = ((char*)from)[index ^ 7];
	}
}